

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O1

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_atom<char_const*>
          (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,
          regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
          *this,char **begin,char *end)

{
  compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
  *this_00;
  char *pcVar1;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar2;
  byte *pbVar3;
  compiler_token_type cVar4;
  long *plVar5;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  syntax_option_type flags;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *in_R8;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *in_R9;
  bool bVar7;
  escape_value eVar8;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::assert_eos_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  xpr;
  regex_error local_88;
  source_location local_48;
  
  pcVar1 = *begin;
  this_00 = (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
             *)(this + 0x10);
  cVar4 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          ::get_token<char_const*>(this_00,begin,end);
  flags = (syntax_option_type)this_00;
  switch(cVar4) {
  case token_literal:
    parse_literal<char_const*>((string_type *)&local_88,this,begin,end);
    detail::
    make_literal_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)&local_88,
               (string_type *)(ulong)*(uint *)(this + 0x220),flags,in_R8);
    goto LAB_00129e2e;
  case token_any:
    detail::
    make_any_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)(ulong)*(uint *)(this + 0x220),flags,
               (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
               &switchD_00129cfa::switchdataD_0016b1b8);
    break;
  case token_escape:
    eVar8 = parse_escape<char_const*>(this,begin,end);
    if (eVar8._8_8_ >> 0x20 == 0) {
      detail::
      make_char_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                (__return_storage_ptr__,(detail *)(ulong)(uint)(int)eVar8.ch_,
                 (char)*(undefined4 *)(this + 0x220),flags,in_R8);
      return __return_storage_ptr__;
    }
    if (eVar8.type_ == escape_class) {
      pbVar3 = (byte *)*begin;
      *begin = (char *)(pbVar3 + 1);
      if (*(ushort *)(this + 0x228) == 0) {
        bVar7 = false;
      }
      else {
        bVar7 = (*(ushort *)(this_00 + (ulong)*pbVar3 * 2) & *(ushort *)(this + 0x228)) != 0;
      }
      detail::
      make_posix_charset_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                (__return_storage_ptr__,(detail *)(ulong)eVar8.class_,(ushort)bVar7,
                 SUB41(*(undefined4 *)(this + 0x220),0),flags,in_R9);
      return __return_storage_ptr__;
    }
    if (eVar8.type_ == escape_mark) {
      detail::
      make_backref_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                (__return_storage_ptr__,(detail *)(ulong)(uint)eVar8.mark_nbr_,
                 *(int *)(this + 0x220),flags,in_R8);
      return __return_storage_ptr__;
    }
  case token_group_begin:
    parse_group<char_const*>(__return_storage_ptr__,this,begin,end);
    break;
  case token_group_end:
  case token_alternate:
  case token_charset_end:
  case token_charset_invert:
  case token_charset_hyphen:
  case token_charset_backspace:
  case token_posix_charset_begin:
  case token_posix_charset_end:
  case token_equivalence_class_begin:
  case token_equivalence_class_end:
  case token_collation_element_begin:
  case token_collation_element_end:
  case token_no_mark:
  case token_positive_lookahead:
  case token_negative_lookahead:
  case token_positive_lookbehind:
  case token_negative_lookbehind:
  case token_independent_sub_expression:
  case token_comment:
  case token_recurse:
  case token_rule_assign:
  case token_rule_ref:
  case token_named_mark:
  case token_named_mark_ref:
switchD_00129cfa_caseD_4:
    *begin = pcVar1;
    goto LAB_00129d33;
  case token_invalid_quantifier:
    std::runtime_error::runtime_error(&local_88.super_runtime_error,"quantifier not expected");
    local_88.super_exception.data_.px_ = (error_info_container *)0x0;
    local_88.super_exception.throw_function_ = (char *)0x0;
    local_88.super_exception.throw_file_ = (char *)0x0;
    local_88.super_exception.throw_line_ = -1;
    local_88.super_exception.throw_column_ = -1;
    local_88._0_8_ = &PTR__regex_error_00195328;
    local_88.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_00195350;
    local_88.code_ = error_badrepeat;
    local_48.file_ =
         "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
    ;
    local_48.function_ =
         "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_atom(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
    ;
    local_48.line_ = 0x231;
    local_48.column_ = 0;
    throw_exception<boost::xpressive::regex_error>(&local_88,&local_48);
  case token_charset_begin:
    parse_charset<char_const*>(__return_storage_ptr__,this,begin,end);
    break;
  case token_quote_meta_begin:
    parse_quote_meta<char_const*>((string_type *)&local_88,this,begin,end);
    detail::
    make_literal_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)&local_88,
               (string_type *)(ulong)*(uint *)(this + 0x220),flags,in_R8);
LAB_00129e2e:
    if (local_88._0_8_ != (long)&local_88 + 0x10U) {
      operator_delete((void *)local_88._0_8_);
    }
    break;
  case token_quote_meta_end:
    std::runtime_error::runtime_error
              (&local_88.super_runtime_error,
               "found quote-meta end without corresponding quote-meta begin");
    local_88.super_exception.data_.px_ = (error_info_container *)0x0;
    local_88.super_exception.throw_function_ = (char *)0x0;
    local_88.super_exception.throw_file_ = (char *)0x0;
    local_88.super_exception.throw_line_ = -1;
    local_88.super_exception.throw_column_ = -1;
    local_88._0_8_ = &PTR__regex_error_00195328;
    local_88.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_00195350;
    local_88.code_ = error_escape;
    local_48.file_ =
         "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
    ;
    local_48.function_ =
         "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_atom(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
    ;
    local_48.line_ = 0x240;
    local_48.column_ = 0;
    throw_exception<boost::xpressive::regex_error>(&local_88,&local_48);
  case token_assert_begin_sequence:
    plVar5 = (long *)operator_new(0x18);
    *(undefined4 *)(plVar5 + 1) = 0;
    *plVar5 = (long)&PTR__dynamic_xpression_00196578;
    psVar6 = detail::
             get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
    ;
    pmVar2 = (psVar6->xpr_).px;
    plVar5[2] = (long)pmVar2;
    if (pmVar2 != (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0) {
      LOCK();
      (pmVar2->
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).count_.value_ =
           (pmVar2->
           super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ).count_.value_ + 1;
      UNLOCK();
    }
    LOCK();
    *(int *)(plVar5 + 1) = (int)plVar5[1] + 1;
    UNLOCK();
    local_88._0_8_ = plVar5;
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::sequence<boost::xpressive::detail::assert_bos_matcher>
              (__return_storage_ptr__,
               (intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::assert_bos_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_88);
    goto LAB_00129eff;
  case token_assert_end_sequence:
    plVar5 = (long *)operator_new(0x18);
    *(undefined4 *)(plVar5 + 1) = 0;
    *plVar5 = (long)&PTR__dynamic_xpression_00196600;
    psVar6 = detail::
             get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
    ;
    pmVar2 = (psVar6->xpr_).px;
    plVar5[2] = (long)pmVar2;
    if (pmVar2 != (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0) {
      LOCK();
      (pmVar2->
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).count_.value_ =
           (pmVar2->
           super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ).count_.value_ + 1;
      UNLOCK();
    }
    LOCK();
    *(int *)(plVar5 + 1) = (int)plVar5[1] + 1;
    UNLOCK();
    local_88._0_8_ = plVar5;
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::sequence<boost::xpressive::detail::assert_eos_matcher>
              (__return_storage_ptr__,
               (intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::assert_eos_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_88);
LAB_00129eff:
    if ((long *)local_88._0_8_ != (long *)0x0) {
      LOCK();
      plVar5 = (long *)(local_88._0_8_ + 8);
      *(int *)plVar5 = (int)*plVar5 + -1;
      UNLOCK();
      if ((int)*plVar5 == 0) {
        (**(code **)(*(long *)local_88._0_8_ + 8))();
      }
    }
    break;
  case token_assert_begin_line:
    detail::
    make_assert_begin_line<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)(ulong)*(uint *)(this + 0x220),flags,
               (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
               &switchD_00129cfa::switchdataD_0016b1b8);
    break;
  case token_assert_end_line:
    detail::
    make_assert_end_line<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)(ulong)*(uint *)(this + 0x220),flags,
               (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
               &switchD_00129cfa::switchdataD_0016b1b8);
    break;
  case token_assert_word_begin:
    detail::
    make_assert_word<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::word_begin,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)this_00);
    break;
  case token_assert_word_end:
    detail::
    make_assert_word<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::word_end,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)this_00);
    break;
  case token_assert_word_boundary:
    detail::
    make_assert_word<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::word_boundary<mpl_::bool_<true>>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)this_00);
    break;
  case token_assert_not_word_boundary:
    detail::
    make_assert_word<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::word_boundary<mpl_::bool_<false>>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,(detail *)this_00);
    break;
  default:
    if (cVar4 != token_end_of_pattern) goto switchD_00129cfa_caseD_4;
LAB_00129d33:
    __return_storage_ptr__->pure_ = true;
    (__return_storage_ptr__->width_).value_ = 0;
    __return_storage_ptr__->quant_ = quant_none;
    (__return_storage_ptr__->head_).xpr_.px =
         (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    __return_storage_ptr__->tail_ =
         (shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (__return_storage_ptr__->alt_end_xpr_).px =
         (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    __return_storage_ptr__->alternates_ =
         (alternates_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

detail::sequence<BidiIter> parse_atom(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        escape_value esc = { 0, 0, 0, detail::escape_char };
        FwdIter old_begin = begin;

        switch(this->traits_.get_token(begin, end))
        {
        case token_literal:
            return detail::make_literal_xpression<BidiIter>
            (
                this->parse_literal(begin, end), this->traits_.flags(), this->rxtraits()
            );

        case token_any:
            return detail::make_any_xpression<BidiIter>(this->traits_.flags(), this->rxtraits());

        case token_assert_begin_sequence:
            return detail::make_dynamic<BidiIter>(detail::assert_bos_matcher());

        case token_assert_end_sequence:
            return detail::make_dynamic<BidiIter>(detail::assert_eos_matcher());

        case token_assert_begin_line:
            return detail::make_assert_begin_line<BidiIter>(this->traits_.flags(), this->rxtraits());

        case token_assert_end_line:
            return detail::make_assert_end_line<BidiIter>(this->traits_.flags(), this->rxtraits());

        case token_assert_word_boundary:
            return detail::make_assert_word<BidiIter>(detail::word_boundary<mpl::true_>(), this->rxtraits());

        case token_assert_not_word_boundary:
            return detail::make_assert_word<BidiIter>(detail::word_boundary<mpl::false_>(), this->rxtraits());

        case token_assert_word_begin:
            return detail::make_assert_word<BidiIter>(detail::word_begin(), this->rxtraits());

        case token_assert_word_end:
            return detail::make_assert_word<BidiIter>(detail::word_end(), this->rxtraits());

        case token_escape:
            esc = this->parse_escape(begin, end);
            switch(esc.type_)
            {
            case detail::escape_mark:
                return detail::make_backref_xpression<BidiIter>
                (
                    esc.mark_nbr_, this->traits_.flags(), this->rxtraits()
                );
            case detail::escape_char:
                return detail::make_char_xpression<BidiIter>
                (
                    esc.ch_, this->traits_.flags(), this->rxtraits()
                );
            case detail::escape_class:
                return detail::make_posix_charset_xpression<BidiIter>
                (
                    esc.class_
                  , this->is_upper_(*begin++)
                  , this->traits_.flags()
                  , this->rxtraits()
                );
            }

        case token_group_begin:
            return this->parse_group(begin, end);

        case token_charset_begin:
            return this->parse_charset(begin, end);

        case token_invalid_quantifier:
            BOOST_THROW_EXCEPTION(regex_error(error_badrepeat, "quantifier not expected"));
            break;

        case token_quote_meta_begin:
            return detail::make_literal_xpression<BidiIter>
            (
                this->parse_quote_meta(begin, end), this->traits_.flags(), this->rxtraits()
            );

        case token_quote_meta_end:
            BOOST_THROW_EXCEPTION(
                regex_error(
                    error_escape
                  , "found quote-meta end without corresponding quote-meta begin"
                )
            );
            break;

        case token_end_of_pattern:
            break;

        default:
            begin = old_begin;
            break;
        }

        return detail::sequence<BidiIter>();
    }